

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

void duckdb::VerifyNotExcluded(ParsedExpression *expr)

{
  bool bVar1;
  ColumnRefExpression *this;
  string *__lhs;
  NotImplementedException *this_00;
  allocator local_39;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if ((expr->super_BaseExpression).type == COLUMN_REF) {
    this = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    bVar1 = ColumnRefExpression::IsQualified(this);
    if (bVar1) {
      __lhs = ColumnRefExpression::GetTableName_abi_cxx11_(this);
      bVar1 = ::std::operator==(__lhs,"excluded");
      if (bVar1) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)local_38._M_pod_data,
                   "\'excluded\' qualified columns are not supported in the RETURNING clause yet",
                   &local_39);
        NotImplementedException::NotImplementedException(this_00,(string *)&local_38);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
    }
  }
  else {
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_20 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:675:12)>
               ::_M_invoke;
    local_28 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:675:12)>
               ::_M_manager;
    ParsedExpressionIterator::EnumerateChildren
              (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_38);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  }
  return;
}

Assistant:

void VerifyNotExcluded(ParsedExpression &expr) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &column_ref = expr.Cast<ColumnRefExpression>();
		if (!column_ref.IsQualified()) {
			return;
		}
		auto &table_name = column_ref.GetTableName();
		if (table_name == "excluded") {
			throw NotImplementedException("'excluded' qualified columns are not supported in the RETURNING clause yet");
		}
		return;
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { VerifyNotExcluded((ParsedExpression &)child); });
}